

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQTWrapUICommand.cxx
# Opt level: O3

bool __thiscall
cmQTWrapUICommand::InitialPass
          (cmQTWrapUICommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *def;
  cmMakefile *pcVar1;
  pointer pbVar2;
  long *plVar3;
  size_type sVar4;
  pointer pbVar5;
  bool bVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  cmSourceFile *this_00;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer pbVar12;
  string *def_00;
  string *sourceName;
  string no_main_dependency;
  string headerListValue;
  string local_218;
  string srcName;
  string uiName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string hName;
  cmCustomCommandLine cxxCommand;
  string mocName;
  string cxxName;
  string sourceListValue;
  cmCustomCommandLine mocCommand;
  cmCustomCommandLine hCommand;
  cmCustomCommandLines mocCommandLines;
  cmCustomCommandLines cxxCommandLines;
  cmCustomCommandLines hCommandLines;
  
  uVar10 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  paVar11 = &headerListValue.field_2;
  headerListValue._M_dataplus._M_p = (pointer)paVar11;
  if (uVar10 < 0x61) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&headerListValue,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&headerListValue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)headerListValue._M_dataplus._M_p == paVar11) goto LAB_00334c5c;
  }
  else {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&headerListValue,"QT_UIC_EXECUTABLE","");
    pcVar7 = cmMakefile::GetRequiredDefinition(pcVar1,&headerListValue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)headerListValue._M_dataplus._M_p != paVar11) {
      operator_delete(headerListValue._M_dataplus._M_p,
                      headerListValue.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    headerListValue._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&headerListValue,"QT_MOC_EXECUTABLE","");
    pcVar8 = cmMakefile::GetRequiredDefinition(pcVar1,&headerListValue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)headerListValue._M_dataplus._M_p != paVar11) {
      operator_delete(headerListValue._M_dataplus._M_p,
                      headerListValue.field_2._M_allocated_capacity + 1);
    }
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    def = pbVar2 + 1;
    pcVar9 = cmMakefile::GetSafeDefinition((this->super_cmCommand).Makefile,def);
    std::__cxx11::string::string((string *)&headerListValue,pcVar9,(allocator *)&sourceListValue);
    def_00 = pbVar2 + 2;
    pcVar9 = cmMakefile::GetSafeDefinition((this->super_cmCommand).Makefile,def_00);
    std::__cxx11::string::string((string *)&sourceListValue,pcVar9,(allocator *)&srcName);
    sourceName = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3;
    if (sourceName !=
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        this_00 = cmMakefile::GetSource((this->super_cmCommand).Makefile,sourceName);
        if (this_00 == (cmSourceFile *)0x0) {
LAB_0033424a:
          cmsys::SystemTools::GetFilenameWithoutLastExtension(&srcName,sourceName);
          pcVar9 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
          std::__cxx11::string::string((string *)&hName,pcVar9,(allocator *)&cxxName);
          std::__cxx11::string::append((char *)&hName);
          std::__cxx11::string::_M_append((char *)&hName,(ulong)srcName._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&hName);
          pcVar9 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
          std::__cxx11::string::string((string *)&cxxName,pcVar9,(allocator *)&mocName);
          std::__cxx11::string::append((char *)&cxxName);
          std::__cxx11::string::_M_append((char *)&cxxName,(ulong)srcName._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&cxxName);
          pcVar9 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
          std::__cxx11::string::string((string *)&mocName,pcVar9,(allocator *)&uiName);
          std::__cxx11::string::append((char *)&mocName);
          std::__cxx11::string::_M_append((char *)&mocName,(ulong)srcName._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&mocName);
          uiName._M_dataplus._M_p = (pointer)&uiName.field_2;
          uiName._M_string_length = 0;
          uiName.field_2._M_local_buf[0] = '\0';
          bVar6 = cmsys::SystemTools::FileIsFullPath((sourceName->_M_dataplus)._M_p);
          if (bVar6) {
            std::__cxx11::string::_M_assign((string *)&uiName);
          }
          else {
            if (this_00 == (cmSourceFile *)0x0) {
LAB_00334406:
              pcVar9 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
            }
            else {
              no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&no_main_dependency,"GENERATED","");
              bVar6 = cmSourceFile::GetPropertyAsBool(this_00,&no_main_dependency);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
                operator_delete(no_main_dependency._M_dataplus._M_p,
                                CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                         no_main_dependency.field_2._M_local_buf[0]) + 1);
              }
              if (!bVar6) goto LAB_00334406;
              pcVar9 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
            }
            sVar4 = uiName._M_string_length;
            strlen(pcVar9);
            std::__cxx11::string::_M_replace((ulong)&uiName,0,(char *)sVar4,(ulong)pcVar9);
            std::__cxx11::string::append((char *)&uiName);
            std::__cxx11::string::_M_append((char *)&uiName,(ulong)(sourceName->_M_dataplus)._M_p);
          }
          if (headerListValue._M_string_length != 0) {
            std::__cxx11::string::append((char *)&headerListValue);
          }
          std::__cxx11::string::_M_append((char *)&headerListValue,(ulong)hName._M_dataplus._M_p);
          if (sourceListValue._M_string_length != 0) {
            std::__cxx11::string::append((char *)&sourceListValue);
          }
          std::__cxx11::string::_M_append((char *)&sourceListValue,(ulong)cxxName._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&sourceListValue);
          std::__cxx11::string::_M_append((char *)&sourceListValue,(ulong)mocName._M_dataplus._M_p);
          hCommand.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          hCommand.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          hCommand.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string((string *)&no_main_dependency,pcVar7,(allocator *)&local_218)
          ;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hCommand,
                     &no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                     no_main_dependency.field_2._M_local_buf[0]) + 1);
          }
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&no_main_dependency,"-o","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hCommand,
                     &no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                     no_main_dependency.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&hCommand.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,&hName);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&hCommand.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,&uiName);
          hCommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          hCommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          hCommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                    (&hCommandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                     (value_type *)
                     &hCommand.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
          cxxCommand.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          cxxCommand.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          cxxCommand.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string((string *)&no_main_dependency,pcVar7,(allocator *)&local_218)
          ;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &cxxCommand,&no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                     no_main_dependency.field_2._M_local_buf[0]) + 1);
          }
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&no_main_dependency,"-impl","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &cxxCommand,&no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                     no_main_dependency.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&cxxCommand.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,&hName);
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&no_main_dependency,"-o","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &cxxCommand,&no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                     no_main_dependency.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&cxxCommand.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,&cxxName);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&cxxCommand.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,&uiName);
          cxxCommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          cxxCommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          cxxCommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                    (&cxxCommandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                     (value_type *)
                     &cxxCommand.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
          mocCommand.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          mocCommand.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          mocCommand.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string((string *)&no_main_dependency,pcVar8,(allocator *)&local_218)
          ;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mocCommand,&no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                     no_main_dependency.field_2._M_local_buf[0]) + 1);
          }
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&no_main_dependency,"-o","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mocCommand,&no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                     no_main_dependency.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&mocCommand.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,&mocName);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&mocCommand.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,&hName);
          mocCommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          mocCommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          mocCommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                    (&mocCommandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                     (value_type *)
                     &mocCommand.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&depends,&uiName);
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          no_main_dependency._M_string_length = 0;
          no_main_dependency.field_2._M_local_buf[0] = '\0';
          pcVar1 = (this->super_cmCommand).Makefile;
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
          cmMakefile::AddCustomCommandToOutput
                    (pcVar1,&hName,&depends,&no_main_dependency,&hCommandLines,(char *)0x0,
                     (char *)0x0,false,true,false,false,&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&depends,&hName);
          pcVar1 = (this->super_cmCommand).Makefile;
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
          cmMakefile::AddCustomCommandToOutput
                    (pcVar1,&cxxName,&depends,&no_main_dependency,&cxxCommandLines,(char *)0x0,
                     (char *)0x0,false,true,false,false,&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          pbVar5 = depends.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar2 = depends.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar11 = &(depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar3 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar11 + -1))->_M_dataplus)._M_p;
              if (paVar11 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar3) {
                operator_delete(plVar3,paVar11->_M_allocated_capacity + 1);
              }
              pbVar12 = (pointer)(paVar11 + 1);
              paVar11 = paVar11 + 2;
            } while (pbVar12 != pbVar5);
            depends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&depends,&hName);
          pcVar1 = (this->super_cmCommand).Makefile;
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
          cmMakefile::AddCustomCommandToOutput
                    (pcVar1,&mocName,&depends,&no_main_dependency,&mocCommandLines,(char *)0x0,
                     (char *)0x0,false,true,false,false,&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                     no_main_dependency.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&depends);
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                    (&mocCommandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&mocCommand.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                    (&cxxCommandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&cxxCommand.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                    (&hCommandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&hCommand.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uiName._M_dataplus._M_p != &uiName.field_2) {
            operator_delete(uiName._M_dataplus._M_p,
                            CONCAT71(uiName.field_2._M_allocated_capacity._1_7_,
                                     uiName.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)mocName._M_dataplus._M_p != &mocName.field_2) {
            operator_delete(mocName._M_dataplus._M_p,mocName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cxxName._M_dataplus._M_p != &cxxName.field_2) {
            operator_delete(cxxName._M_dataplus._M_p,cxxName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)hName._M_dataplus._M_p != &hName.field_2) {
            operator_delete(hName._M_dataplus._M_p,hName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)srcName._M_dataplus._M_p != &srcName.field_2) {
            operator_delete(srcName._M_dataplus._M_p,srcName.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          srcName._M_dataplus._M_p = (pointer)&srcName.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&srcName,"WRAP_EXCLUDE","");
          bVar6 = cmSourceFile::GetPropertyAsBool(this_00,&srcName);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)srcName._M_dataplus._M_p != &srcName.field_2) {
            operator_delete(srcName._M_dataplus._M_p,srcName.field_2._M_allocated_capacity + 1);
          }
          if (!bVar6) goto LAB_0033424a;
        }
        sourceName = sourceName + 1;
      } while (sourceName !=
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,def_00,sourceListValue._M_dataplus._M_p);
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,def,headerListValue._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
      operator_delete(sourceListValue._M_dataplus._M_p,
                      sourceListValue.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)headerListValue._M_dataplus._M_p == &headerListValue.field_2) goto LAB_00334c5c;
  }
  operator_delete(headerListValue._M_dataplus._M_p,headerListValue.field_2._M_allocated_capacity + 1
                 );
LAB_00334c5c:
  return 0x60 < uVar10;
}

Assistant:

bool cmQTWrapUICommand::InitialPass(std::vector<std::string> const& args,
                                    cmExecutionStatus&)
{
  if (args.size() < 4) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // Get the uic and moc executables to run in the custom commands.
  const char* uic_exe =
    this->Makefile->GetRequiredDefinition("QT_UIC_EXECUTABLE");
  const char* moc_exe =
    this->Makefile->GetRequiredDefinition("QT_MOC_EXECUTABLE");

  // Get the variable holding the list of sources.
  std::string const& headerList = args[1];
  std::string const& sourceList = args[2];
  std::string headerListValue = this->Makefile->GetSafeDefinition(headerList);
  std::string sourceListValue = this->Makefile->GetSafeDefinition(sourceList);

  // Create rules for all sources listed.
  for (std::vector<std::string>::const_iterator j = (args.begin() + 3);
       j != args.end(); ++j) {
    cmSourceFile* curr = this->Makefile->GetSource(*j);
    // if we should wrap the class
    if (!(curr && curr->GetPropertyAsBool("WRAP_EXCLUDE"))) {
      // Compute the name of the files to generate.
      std::string srcName = cmSystemTools::GetFilenameWithoutLastExtension(*j);
      std::string hName = this->Makefile->GetCurrentBinaryDirectory();
      hName += "/";
      hName += srcName;
      hName += ".h";
      std::string cxxName = this->Makefile->GetCurrentBinaryDirectory();
      cxxName += "/";
      cxxName += srcName;
      cxxName += ".cxx";
      std::string mocName = this->Makefile->GetCurrentBinaryDirectory();
      mocName += "/moc_";
      mocName += srcName;
      mocName += ".cxx";

      // Compute the name of the ui file from which to generate others.
      std::string uiName;
      if (cmSystemTools::FileIsFullPath(j->c_str())) {
        uiName = *j;
      } else {
        if (curr && curr->GetPropertyAsBool("GENERATED")) {
          uiName = this->Makefile->GetCurrentBinaryDirectory();
        } else {
          uiName = this->Makefile->GetCurrentSourceDirectory();
        }
        uiName += "/";
        uiName += *j;
      }

      // create the list of headers
      if (!headerListValue.empty()) {
        headerListValue += ";";
      }
      headerListValue += hName;

      // create the list of sources
      if (!sourceListValue.empty()) {
        sourceListValue += ";";
      }
      sourceListValue += cxxName;
      sourceListValue += ";";
      sourceListValue += mocName;

      // set up .ui to .h and .cxx command
      cmCustomCommandLine hCommand;
      hCommand.push_back(uic_exe);
      hCommand.push_back("-o");
      hCommand.push_back(hName);
      hCommand.push_back(uiName);
      cmCustomCommandLines hCommandLines;
      hCommandLines.push_back(hCommand);

      cmCustomCommandLine cxxCommand;
      cxxCommand.push_back(uic_exe);
      cxxCommand.push_back("-impl");
      cxxCommand.push_back(hName);
      cxxCommand.push_back("-o");
      cxxCommand.push_back(cxxName);
      cxxCommand.push_back(uiName);
      cmCustomCommandLines cxxCommandLines;
      cxxCommandLines.push_back(cxxCommand);

      cmCustomCommandLine mocCommand;
      mocCommand.push_back(moc_exe);
      mocCommand.push_back("-o");
      mocCommand.push_back(mocName);
      mocCommand.push_back(hName);
      cmCustomCommandLines mocCommandLines;
      mocCommandLines.push_back(mocCommand);

      std::vector<std::string> depends;
      depends.push_back(uiName);
      std::string no_main_dependency;
      const char* no_comment = CM_NULLPTR;
      const char* no_working_dir = CM_NULLPTR;
      this->Makefile->AddCustomCommandToOutput(
        hName, depends, no_main_dependency, hCommandLines, no_comment,
        no_working_dir);

      depends.push_back(hName);
      this->Makefile->AddCustomCommandToOutput(
        cxxName, depends, no_main_dependency, cxxCommandLines, no_comment,
        no_working_dir);

      depends.clear();
      depends.push_back(hName);
      this->Makefile->AddCustomCommandToOutput(
        mocName, depends, no_main_dependency, mocCommandLines, no_comment,
        no_working_dir);
    }
  }

  // Store the final list of source files and headers.
  this->Makefile->AddDefinition(sourceList, sourceListValue.c_str());
  this->Makefile->AddDefinition(headerList, headerListValue.c_str());
  return true;
}